

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Extractor::extract(Extractor *this,char *blob_name,Mat *feat,int type)

{
  FILE *__stream;
  int iVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  size_type sVar2;
  const_reference ppcVar3;
  char *in_RDI;
  size_t i;
  vector<const_char_*,_std::allocator<const_char_*>_> *output_names;
  int blob_index;
  int in_stack_00000204;
  Mat *in_stack_00000208;
  int in_stack_00000214;
  Extractor *in_stack_00000218;
  Net *in_stack_ffffffffffffffc8;
  ulong uVar4;
  ulong __n;
  int local_4;
  
  iVar1 = Net::find_blob_index_by_name(in_stack_ffffffffffffffc8,in_RDI);
  if (iVar1 == -1) {
    fprintf(_stderr,"Try");
    fprintf(_stderr,"\n");
    this_00 = Net::output_names((Net *)**(undefined8 **)(in_RDI + 8));
    uVar4 = 0;
    while( true ) {
      __n = uVar4;
      sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(this_00);
      __stream = _stderr;
      if (sVar2 <= uVar4) break;
      ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](this_00,__n);
      fprintf(__stream,"    ex.extract(\"%s\", out%d);",*ppcVar3,__n & 0xffffffff);
      fprintf(_stderr,"\n");
      uVar4 = __n + 1;
    }
    local_4 = -1;
  }
  else {
    local_4 = extract(in_stack_00000218,in_stack_00000214,in_stack_00000208,in_stack_00000204);
  }
  return local_4;
}

Assistant:

int Extractor::extract(const char* blob_name, Mat& feat, int type)
{
    int blob_index = d->net->find_blob_index_by_name(blob_name);
    if (blob_index == -1)
    {
        NCNN_LOGE("Try");
        const std::vector<const char*>& output_names = d->net->output_names();
        for (size_t i = 0; i < output_names.size(); i++)
        {
            NCNN_LOGE("    ex.extract(\"%s\", out%d);", output_names[i], (int)i);
        }

        return -1;
    }

    return extract(blob_index, feat, type);
}